

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O3

void embree::avx::FlatLinearCurveMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  float fVar23;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  float fVar35;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar43;
  float fVar44;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar45;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar49;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar71;
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar72 [32];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar83 [64];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  float in_register_0000151c;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  LineIntersectorHitM<8> hit;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  RTCFilterFunctionNArguments local_370;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar73 [64];
  undefined1 auVar76 [64];
  
  pSVar9 = context->scene;
  uVar19 = line->sharedGeomID;
  uVar18 = (line->v0).field_0.i[0];
  pGVar10 = (pSVar9->geometries).items[uVar19].ptr;
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  p_Var12 = pGVar10[1].intersectionFilterN;
  uVar20 = (line->v0).field_0.i[1];
  uVar3 = (line->v0).field_0.i[4];
  auVar24._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar3 * (long)p_Var12);
  auVar24._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar18 * (long)p_Var12);
  uVar4 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[3];
  uVar6 = (line->v0).field_0.i[5];
  auVar39._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar6 * (long)p_Var12);
  auVar39._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar20 * (long)p_Var12);
  uVar7 = (line->v0).field_0.i[6];
  auVar50._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar7 * (long)p_Var12);
  auVar50._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar4 * (long)p_Var12);
  uVar8 = (line->v0).field_0.i[7];
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar8 * (long)p_Var12);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar5 * (long)p_Var12);
  auVar61._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar3 + 1) * (long)p_Var12);
  auVar61._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar18 + 1) * (long)p_Var12);
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar6 + 1) * (long)p_Var12);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar20 + 1) * (long)p_Var12);
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar7 + 1) * (long)p_Var12);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar4 + 1) * (long)p_Var12);
  auVar74._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar8 + 1) * (long)p_Var12);
  auVar74._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar5 + 1) * (long)p_Var12);
  auVar15 = vunpcklps_avx(auVar24,auVar50);
  auVar13 = vunpckhps_avx(auVar24,auVar50);
  auVar90 = vunpcklps_avx(auVar39,auVar59);
  auVar14 = vunpckhps_avx(auVar39,auVar59);
  auVar24 = vunpcklps_avx(auVar15,auVar90);
  local_3e0 = vunpckhps_avx(auVar15,auVar90);
  local_220 = vunpcklps_avx(auVar13,auVar14);
  local_1a0 = vunpckhps_avx(auVar13,auVar14);
  auVar15 = vunpcklps_avx(auVar61,auVar66);
  auVar13 = vunpckhps_avx(auVar61,auVar66);
  auVar90 = vunpcklps_avx(auVar64,auVar74);
  auVar14 = vunpckhps_avx(auVar64,auVar74);
  local_1e0 = vunpcklps_avx(auVar15,auVar90);
  local_200 = vunpckhps_avx(auVar15,auVar90);
  auVar39 = vunpcklps_avx(auVar13,auVar14);
  auVar37 = vpcmpeqd_avx(auVar39._0_16_,auVar39._0_16_);
  auVar38 = vpcmpeqd_avx(auVar37,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar37 = vpcmpeqd_avx(auVar37,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_1c0 = vunpckhps_avx(auVar13,auVar14);
  auVar25._16_16_ = auVar37;
  auVar25._0_16_ = auVar38;
  local_2f0 = vshufps_avx(ZEXT416(uVar19),ZEXT416(uVar19),0);
  local_300 = local_2f0;
  fVar49 = pre->ray_space[k].vy.field_0.m128[0];
  fVar23 = pre->ray_space[k].vy.field_0.m128[1];
  fVar30 = pre->ray_space[k].vz.field_0.m128[0];
  fVar31 = pre->ray_space[k].vz.field_0.m128[1];
  fVar71 = *(float *)(ray + k * 4 + 0x20);
  auVar68._4_4_ = fVar71;
  auVar68._0_4_ = fVar71;
  auVar68._8_4_ = fVar71;
  auVar68._12_4_ = fVar71;
  auVar68._16_4_ = fVar71;
  auVar68._20_4_ = fVar71;
  auVar68._24_4_ = fVar71;
  auVar68._28_4_ = fVar71;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  auVar13 = vsubps_avx(local_3e0,auVar68);
  auVar14 = vsubps_avx(local_220,auVar40);
  fVar46 = auVar14._0_4_;
  fVar47 = auVar14._4_4_;
  fVar48 = auVar14._8_4_;
  fVar43 = auVar14._12_4_;
  fVar45 = auVar14._16_4_;
  fVar54 = auVar14._20_4_;
  fVar77 = auVar14._24_4_;
  fVar57 = auVar13._0_4_;
  fVar58 = auVar13._4_4_;
  fVar36 = auVar13._8_4_;
  fVar44 = auVar13._12_4_;
  fVar53 = auVar13._16_4_;
  fVar55 = auVar13._20_4_;
  fVar78 = auVar13._24_4_;
  fVar32 = pre->ray_space[k].vy.field_0.m128[2];
  fVar33 = pre->ray_space[k].vz.field_0.m128[2];
  fVar34 = pre->ray_space[k].vx.field_0.m128[0];
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  auVar67._16_4_ = uVar1;
  auVar67._20_4_ = uVar1;
  auVar67._24_4_ = uVar1;
  auVar67._28_4_ = uVar1;
  auVar15 = vsubps_avx(auVar24,auVar67);
  fVar79 = auVar15._0_4_;
  fVar80 = auVar15._4_4_;
  fVar81 = auVar15._8_4_;
  fVar82 = auVar15._12_4_;
  fVar84 = auVar15._16_4_;
  fVar85 = auVar15._20_4_;
  fVar86 = auVar15._24_4_;
  auVar51._0_4_ = fVar79 * fVar34 + fVar30 * fVar46 + fVar49 * fVar57;
  auVar51._4_4_ = fVar80 * fVar34 + fVar30 * fVar47 + fVar49 * fVar58;
  auVar51._8_4_ = fVar81 * fVar34 + fVar30 * fVar48 + fVar49 * fVar36;
  auVar51._12_4_ = fVar82 * fVar34 + fVar30 * fVar43 + fVar49 * fVar44;
  auVar51._16_4_ = fVar84 * fVar34 + fVar30 * fVar45 + fVar49 * fVar53;
  auVar51._20_4_ = fVar85 * fVar34 + fVar30 * fVar54 + fVar49 * fVar55;
  auVar51._24_4_ = fVar86 * fVar34 + fVar30 * fVar77 + fVar49 * fVar78;
  auVar51._28_4_ = in_register_0000151c + in_register_0000151c + local_3e0._28_4_;
  fVar35 = pre->ray_space[k].vx.field_0.m128[1];
  auVar89._0_4_ = fVar79 * fVar35 + fVar23 * fVar57 + fVar31 * fVar46;
  auVar89._4_4_ = fVar80 * fVar35 + fVar23 * fVar58 + fVar31 * fVar47;
  auVar89._8_4_ = fVar81 * fVar35 + fVar23 * fVar36 + fVar31 * fVar48;
  auVar89._12_4_ = fVar82 * fVar35 + fVar23 * fVar44 + fVar31 * fVar43;
  auVar89._16_4_ = fVar84 * fVar35 + fVar23 * fVar53 + fVar31 * fVar45;
  auVar89._20_4_ = fVar85 * fVar35 + fVar23 * fVar55 + fVar31 * fVar54;
  auVar89._24_4_ = fVar86 * fVar35 + fVar23 * fVar78 + fVar31 * fVar77;
  auVar89._28_4_ = in_register_0000151c + local_220._28_4_ + in_register_0000151c;
  fVar56 = pre->ray_space[k].vx.field_0.m128[2];
  auVar87._0_4_ = fVar56 * fVar79 + fVar57 * fVar32 + fVar46 * fVar33;
  auVar87._4_4_ = fVar56 * fVar80 + fVar58 * fVar32 + fVar47 * fVar33;
  auVar87._8_4_ = fVar56 * fVar81 + fVar36 * fVar32 + fVar48 * fVar33;
  auVar87._12_4_ = fVar56 * fVar82 + fVar44 * fVar32 + fVar43 * fVar33;
  auVar87._16_4_ = fVar56 * fVar84 + fVar53 * fVar32 + fVar45 * fVar33;
  auVar87._20_4_ = fVar56 * fVar85 + fVar55 * fVar32 + fVar54 * fVar33;
  auVar87._24_4_ = fVar56 * fVar86 + fVar78 * fVar32 + fVar77 * fVar33;
  auVar87._28_4_ = auVar15._28_4_ + auVar13._28_4_ + auVar14._28_4_;
  auVar13 = vsubps_avx(auVar39,auVar40);
  fVar46 = auVar13._0_4_;
  fVar58 = auVar13._4_4_;
  fVar43 = auVar13._8_4_;
  fVar53 = auVar13._12_4_;
  fVar77 = auVar13._16_4_;
  fVar80 = auVar13._20_4_;
  fVar84 = auVar13._24_4_;
  auVar14 = vsubps_avx(local_200,auVar68);
  fVar57 = auVar14._0_4_;
  fVar48 = auVar14._4_4_;
  fVar44 = auVar14._8_4_;
  fVar54 = auVar14._12_4_;
  fVar78 = auVar14._16_4_;
  fVar81 = auVar14._20_4_;
  fVar85 = auVar14._24_4_;
  fVar71 = auVar39._28_4_ + fVar71;
  auVar15 = vsubps_avx(local_1e0,auVar67);
  fVar47 = auVar15._0_4_;
  fVar36 = auVar15._4_4_;
  fVar45 = auVar15._8_4_;
  fVar55 = auVar15._12_4_;
  fVar79 = auVar15._16_4_;
  fVar82 = auVar15._20_4_;
  fVar86 = auVar15._24_4_;
  auVar62._0_4_ = fVar34 * fVar47 + fVar30 * fVar46 + fVar49 * fVar57;
  auVar62._4_4_ = fVar34 * fVar36 + fVar30 * fVar58 + fVar49 * fVar48;
  auVar62._8_4_ = fVar34 * fVar45 + fVar30 * fVar43 + fVar49 * fVar44;
  auVar62._12_4_ = fVar34 * fVar55 + fVar30 * fVar53 + fVar49 * fVar54;
  auVar62._16_4_ = fVar34 * fVar79 + fVar30 * fVar77 + fVar49 * fVar78;
  auVar62._20_4_ = fVar34 * fVar82 + fVar30 * fVar80 + fVar49 * fVar81;
  auVar62._24_4_ = fVar34 * fVar86 + fVar30 * fVar84 + fVar49 * fVar85;
  auVar62._28_4_ = auVar14._28_4_ + fVar71;
  auVar65._0_4_ = fVar23 * fVar57 + fVar31 * fVar46 + fVar35 * fVar47;
  auVar65._4_4_ = fVar23 * fVar48 + fVar31 * fVar58 + fVar35 * fVar36;
  auVar65._8_4_ = fVar23 * fVar44 + fVar31 * fVar43 + fVar35 * fVar45;
  auVar65._12_4_ = fVar23 * fVar54 + fVar31 * fVar53 + fVar35 * fVar55;
  auVar65._16_4_ = fVar23 * fVar78 + fVar31 * fVar77 + fVar35 * fVar79;
  auVar65._20_4_ = fVar23 * fVar81 + fVar31 * fVar80 + fVar35 * fVar82;
  auVar65._24_4_ = fVar23 * fVar85 + fVar31 * fVar84 + fVar35 * fVar86;
  auVar65._28_4_ = fVar23 + fVar30 + fVar35;
  auVar26._0_4_ = fVar56 * fVar47 + fVar32 * fVar57 + fVar33 * fVar46;
  auVar26._4_4_ = fVar56 * fVar36 + fVar32 * fVar48 + fVar33 * fVar58;
  auVar26._8_4_ = fVar56 * fVar45 + fVar32 * fVar44 + fVar33 * fVar43;
  auVar26._12_4_ = fVar56 * fVar55 + fVar32 * fVar54 + fVar33 * fVar53;
  auVar26._16_4_ = fVar56 * fVar79 + fVar32 * fVar78 + fVar33 * fVar77;
  auVar26._20_4_ = fVar56 * fVar82 + fVar32 * fVar81 + fVar33 * fVar80;
  auVar26._24_4_ = fVar56 * fVar86 + fVar32 * fVar85 + fVar33 * fVar84;
  auVar26._28_4_ = fVar35 + fVar32 + auVar13._28_4_;
  auVar14 = vsubps_avx(auVar62,auVar51);
  auVar13 = vsubps_avx(auVar65,auVar89);
  fVar49 = auVar13._0_4_;
  fVar30 = auVar13._4_4_;
  fVar32 = auVar13._8_4_;
  fVar34 = auVar13._12_4_;
  fVar56 = auVar13._16_4_;
  fVar57 = auVar13._20_4_;
  fVar58 = auVar13._24_4_;
  fVar23 = auVar14._0_4_;
  fVar31 = auVar14._4_4_;
  fVar33 = auVar14._8_4_;
  fVar35 = auVar14._12_4_;
  fVar46 = auVar14._16_4_;
  fVar47 = auVar14._20_4_;
  fVar48 = auVar14._24_4_;
  auVar63._0_4_ = fVar23 * fVar23 + fVar49 * fVar49;
  auVar63._4_4_ = fVar31 * fVar31 + fVar30 * fVar30;
  auVar63._8_4_ = fVar33 * fVar33 + fVar32 * fVar32;
  auVar63._12_4_ = fVar35 * fVar35 + fVar34 * fVar34;
  auVar63._16_4_ = fVar46 * fVar46 + fVar56 * fVar56;
  auVar63._20_4_ = fVar47 * fVar47 + fVar57 * fVar57;
  auVar63._24_4_ = fVar48 * fVar48 + fVar58 * fVar58;
  auVar63._28_4_ = auVar65._28_4_ + auVar62._28_4_;
  auVar15._4_4_ = fVar30 * -auVar89._4_4_;
  auVar15._0_4_ = fVar49 * -auVar89._0_4_;
  auVar15._8_4_ = fVar32 * -auVar89._8_4_;
  auVar15._12_4_ = fVar34 * -auVar89._12_4_;
  auVar15._16_4_ = fVar56 * -auVar89._16_4_;
  auVar15._20_4_ = fVar57 * -auVar89._20_4_;
  auVar15._24_4_ = fVar58 * -auVar89._24_4_;
  auVar15._28_4_ = -auVar89._28_4_;
  auVar13 = vrcpps_avx(auVar63);
  auVar90._4_4_ = auVar51._4_4_ * fVar31;
  auVar90._0_4_ = auVar51._0_4_ * fVar23;
  auVar90._8_4_ = auVar51._8_4_ * fVar33;
  auVar90._12_4_ = auVar51._12_4_ * fVar35;
  auVar90._16_4_ = auVar51._16_4_ * fVar46;
  auVar90._20_4_ = auVar51._20_4_ * fVar47;
  auVar90._24_4_ = auVar51._24_4_ * fVar48;
  auVar90._28_4_ = fVar71;
  auVar15 = vsubps_avx(auVar15,auVar90);
  auVar69._8_4_ = 0x3f800000;
  auVar69._0_8_ = 0x3f8000003f800000;
  auVar69._12_4_ = 0x3f800000;
  auVar69._16_4_ = 0x3f800000;
  auVar69._20_4_ = 0x3f800000;
  auVar69._24_4_ = 0x3f800000;
  auVar69._28_4_ = 0x3f800000;
  fVar71 = auVar13._0_4_;
  fVar36 = auVar13._4_4_;
  auVar16._4_4_ = fVar36 * auVar63._4_4_;
  auVar16._0_4_ = fVar71 * auVar63._0_4_;
  fVar43 = auVar13._8_4_;
  auVar16._8_4_ = fVar43 * auVar63._8_4_;
  fVar44 = auVar13._12_4_;
  auVar16._12_4_ = fVar44 * auVar63._12_4_;
  fVar45 = auVar13._16_4_;
  auVar16._16_4_ = fVar45 * auVar63._16_4_;
  fVar53 = auVar13._20_4_;
  auVar16._20_4_ = fVar53 * auVar63._20_4_;
  fVar54 = auVar13._24_4_;
  auVar16._24_4_ = fVar54 * auVar63._24_4_;
  auVar16._28_4_ = auVar63._28_4_;
  auVar90 = vsubps_avx(auVar69,auVar16);
  auVar17._4_4_ = auVar15._4_4_ * (fVar36 + fVar36 * auVar90._4_4_);
  auVar17._0_4_ = auVar15._0_4_ * (fVar71 + fVar71 * auVar90._0_4_);
  auVar17._8_4_ = auVar15._8_4_ * (fVar43 + fVar43 * auVar90._8_4_);
  auVar17._12_4_ = auVar15._12_4_ * (fVar44 + fVar44 * auVar90._12_4_);
  auVar17._16_4_ = auVar15._16_4_ * (fVar45 + fVar45 * auVar90._16_4_);
  auVar17._20_4_ = auVar15._20_4_ * (fVar53 + fVar53 * auVar90._20_4_);
  auVar17._24_4_ = auVar15._24_4_ * (fVar54 + fVar54 * auVar90._24_4_);
  auVar17._28_4_ = auVar13._28_4_ + auVar90._28_4_;
  auVar13 = vminps_avx(auVar17,auVar69);
  auVar90 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_2e0 = vmaxps_avx(auVar13,auVar90);
  fVar71 = local_2e0._0_4_;
  fVar77 = local_2e0._4_4_;
  fVar78 = local_2e0._8_4_;
  fVar79 = local_2e0._12_4_;
  fVar80 = local_2e0._16_4_;
  fVar81 = local_2e0._20_4_;
  fVar82 = local_2e0._24_4_;
  fVar36 = auVar51._0_4_ + fVar71 * fVar23;
  fVar43 = auVar51._4_4_ + fVar77 * fVar31;
  fVar44 = auVar51._8_4_ + fVar78 * fVar33;
  fVar45 = auVar51._12_4_ + fVar79 * fVar35;
  fVar46 = auVar51._16_4_ + fVar80 * fVar46;
  fVar47 = auVar51._20_4_ + fVar81 * fVar47;
  fVar48 = auVar51._24_4_ + fVar82 * fVar48;
  fVar49 = auVar89._0_4_ + fVar71 * fVar49;
  fVar53 = auVar89._4_4_ + fVar77 * fVar30;
  fVar54 = auVar89._8_4_ + fVar78 * fVar32;
  fVar55 = auVar89._12_4_ + fVar79 * fVar34;
  fVar56 = auVar89._16_4_ + fVar80 * fVar56;
  fVar57 = auVar89._20_4_ + fVar81 * fVar57;
  fVar58 = auVar89._24_4_ + fVar82 * fVar58;
  auVar13 = vsubps_avx(auVar26,auVar87);
  auVar15 = vsubps_avx(local_1c0,local_1a0);
  local_2a0._0_4_ = auVar87._0_4_ + fVar71 * auVar13._0_4_;
  local_2a0._4_4_ = auVar87._4_4_ + fVar77 * auVar13._4_4_;
  local_2a0._8_4_ = auVar87._8_4_ + fVar78 * auVar13._8_4_;
  local_2a0._12_4_ = auVar87._12_4_ + fVar79 * auVar13._12_4_;
  local_2a0._16_4_ = auVar87._16_4_ + fVar80 * auVar13._16_4_;
  local_2a0._20_4_ = auVar87._20_4_ + fVar81 * auVar13._20_4_;
  local_2a0._24_4_ = auVar87._24_4_ + fVar82 * auVar13._24_4_;
  local_2a0._28_4_ = auVar87._28_4_ + auVar13._28_4_;
  auVar70 = ZEXT3264(local_2a0);
  fVar23 = local_1a0._0_4_ + fVar71 * auVar15._0_4_;
  fVar30 = local_1a0._4_4_ + fVar77 * auVar15._4_4_;
  fVar31 = local_1a0._8_4_ + fVar78 * auVar15._8_4_;
  fVar71 = local_1a0._12_4_ + fVar79 * auVar15._12_4_;
  fVar32 = local_1a0._16_4_ + fVar80 * auVar15._16_4_;
  fVar33 = local_1a0._20_4_ + fVar81 * auVar15._20_4_;
  fVar34 = local_1a0._24_4_ + fVar82 * auVar15._24_4_;
  fVar35 = local_1a0._28_4_ + auVar13._28_4_;
  auVar41._0_4_ = fVar36 * fVar36 + fVar49 * fVar49;
  auVar41._4_4_ = fVar43 * fVar43 + fVar53 * fVar53;
  auVar41._8_4_ = fVar44 * fVar44 + fVar54 * fVar54;
  auVar41._12_4_ = fVar45 * fVar45 + fVar55 * fVar55;
  auVar41._16_4_ = fVar46 * fVar46 + fVar56 * fVar56;
  auVar41._20_4_ = fVar47 * fVar47 + fVar57 * fVar57;
  auVar41._24_4_ = fVar48 * fVar48 + fVar58 * fVar58;
  auVar41._28_4_ = auVar51._28_4_ + auVar14._28_4_ + auVar89._28_4_ + auVar51._28_4_;
  auVar13._4_4_ = fVar30 * fVar30;
  auVar13._0_4_ = fVar23 * fVar23;
  auVar13._8_4_ = fVar31 * fVar31;
  auVar13._12_4_ = fVar71 * fVar71;
  auVar13._16_4_ = fVar32 * fVar32;
  auVar13._20_4_ = fVar33 * fVar33;
  auVar13._24_4_ = fVar34 * fVar34;
  auVar13._28_4_ = auVar89._28_4_ + auVar51._28_4_;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar60._4_4_ = uVar1;
  auVar60._0_4_ = uVar1;
  auVar60._8_4_ = uVar1;
  auVar60._12_4_ = uVar1;
  auVar60._16_4_ = uVar1;
  auVar60._20_4_ = uVar1;
  auVar60._24_4_ = uVar1;
  auVar60._28_4_ = uVar1;
  auVar14 = vcmpps_avx(auVar41,auVar13,2);
  auVar13 = vcmpps_avx(auVar60,local_2a0,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar72._4_4_ = uVar1;
  auVar72._0_4_ = uVar1;
  auVar72._8_4_ = uVar1;
  auVar72._12_4_ = uVar1;
  auVar72._16_4_ = uVar1;
  auVar72._20_4_ = uVar1;
  auVar72._24_4_ = uVar1;
  auVar72._28_4_ = uVar1;
  auVar73 = ZEXT3264(auVar72);
  auVar15 = vcmpps_avx(local_2a0,auVar72,2);
  auVar13 = vandps_avx(auVar15,auVar13);
  fVar49 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
  auVar13 = vandps_avx(auVar13,auVar14);
  auVar14._4_4_ = fVar49 * (fVar30 + fVar30);
  auVar14._0_4_ = fVar49 * (fVar23 + fVar23);
  auVar14._8_4_ = fVar49 * (fVar31 + fVar31);
  auVar14._12_4_ = fVar49 * (fVar71 + fVar71);
  auVar14._16_4_ = fVar49 * (fVar32 + fVar32);
  auVar14._20_4_ = fVar49 * (fVar33 + fVar33);
  auVar14._24_4_ = fVar49 * (fVar34 + fVar34);
  auVar14._28_4_ = fVar35 + fVar35;
  auVar14 = vcmpps_avx(local_2a0,auVar14,6);
  auVar13 = vandps_avx(auVar14,auVar13);
  auVar37 = vpslld_avx(auVar13._0_16_,0x1f);
  auVar38 = vpsrad_avx(auVar37,0x1f);
  auVar37 = vpslld_avx(auVar13._16_16_,0x1f);
  auVar37 = vpsrad_avx(auVar37,0x1f);
  auVar27._16_16_ = auVar37;
  auVar27._0_16_ = auVar38;
  auVar13 = auVar27 & ~auVar25;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vandnps_avx(auVar25,auVar27);
    local_280 = vsubps_avx(local_1e0,auVar24);
    local_260 = vsubps_avx(local_200,local_3e0);
    local_240 = vsubps_avx(auVar39,local_220);
    auVar14 = vcmpps_avx(auVar90,local_280,4);
    auVar90 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar15 = vcmpps_avx(auVar90,local_260,4);
    auVar15 = vorps_avx(auVar14,auVar15);
    auVar14 = vcmpps_avx(auVar90,local_240,4);
    auVar14 = vorps_avx(auVar15,auVar14);
    auVar15 = auVar13 & auVar14;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      local_320 = vandps_avx(auVar14,auVar13);
      local_2c0 = ZEXT832(0) << 0x20;
      auVar75._8_4_ = 0x7f800000;
      auVar75._0_8_ = 0x7f8000007f800000;
      auVar75._12_4_ = 0x7f800000;
      auVar75._16_4_ = 0x7f800000;
      auVar75._20_4_ = 0x7f800000;
      auVar75._24_4_ = 0x7f800000;
      auVar75._28_4_ = 0x7f800000;
      auVar76 = ZEXT3264(auVar75);
      auVar13 = vblendvps_avx(auVar75,local_2a0,local_320);
      auVar14 = vshufps_avx(auVar13,auVar13,0xb1);
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar15 = vshufpd_avx(auVar14,auVar14,5);
      auVar14 = vminps_avx(auVar14,auVar15);
      auVar15 = vperm2f128_avx(auVar14,auVar14,1);
      auVar14 = vminps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar13,auVar14,0);
      auVar15 = local_320 & auVar14;
      auVar13 = local_320;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar13 = vandps_avx(auVar14,local_320);
      }
      uVar18 = vmovmskps_avx(auVar13);
      uVar20 = 1 << ((byte)k & 0x1f);
      uVar19 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
      }
      pauVar21 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar20 >> 4) * 0x10);
      auVar13 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar83 = ZEXT3264(auVar13);
      auVar88 = ZEXT464(0) << 0x20;
      do {
        local_370.hit = local_180;
        local_370.valid = (int *)local_400;
        uVar22 = (ulong)uVar19;
        uVar19 = *(uint *)(local_300 + uVar22 * 4);
        pGVar10 = (pSVar9->geometries).items[uVar19].ptr;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_320 + uVar22 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar1 = *(undefined4 *)(local_2e0 + uVar22 * 4);
            uVar2 = *(undefined4 *)(local_2c0 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_280 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_260 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_240 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar1;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
            *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar22];
            *(uint *)(ray + k * 4 + 0x240) = uVar19;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            return;
          }
          local_120 = *(undefined4 *)(local_2e0 + uVar22 * 4);
          local_100 = *(undefined4 *)(local_2c0 + uVar22 * 4);
          auStack_b0 = vpshufd_avx(ZEXT416(uVar19),0);
          local_e0 = (line->primIDs).field_0.i[uVar22];
          uVar1 = *(undefined4 *)(local_280 + uVar22 * 4);
          uVar2 = *(undefined4 *)(local_260 + uVar22 * 4);
          local_160._4_4_ = uVar2;
          local_160._0_4_ = uVar2;
          local_160._8_4_ = uVar2;
          local_160._12_4_ = uVar2;
          local_160._16_4_ = uVar2;
          local_160._20_4_ = uVar2;
          local_160._24_4_ = uVar2;
          local_160._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(local_240 + uVar22 * 4);
          local_140._4_4_ = uVar2;
          local_140._0_4_ = uVar2;
          local_140._8_4_ = uVar2;
          local_140._12_4_ = uVar2;
          local_140._16_4_ = uVar2;
          local_140._20_4_ = uVar2;
          local_140._24_4_ = uVar2;
          local_140._28_4_ = uVar2;
          local_180[0] = (RTCHitN)(char)uVar1;
          local_180[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar1;
          local_180[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar1;
          local_180[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar1;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar1;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar1;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar1;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar1;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          local_340 = auVar83._0_32_;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar22 * 4);
          local_400 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar20 & 0xf) << 4));
          local_3f0 = *pauVar21;
          local_370.geometryUserPtr = pGVar10->userPtr;
          local_370.context = context->user;
          local_370.N = 8;
          local_370.ray = (RTCRayN *)ray;
          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_3a0 = auVar70._0_32_;
            local_3c0 = auVar73._0_32_;
            local_3e0._0_8_ = pauVar21;
            (*pGVar10->intersectionFilterN)(&local_370);
            auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar83 = ZEXT3264(local_340);
            auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar73 = ZEXT3264(local_3c0);
            auVar70 = ZEXT3264(local_3a0);
            pauVar21 = (undefined1 (*) [16])local_3e0._0_8_;
          }
          auVar37 = vpcmpeqd_avx(auVar88._0_16_,local_400);
          auVar38 = vpcmpeqd_avx(auVar88._0_16_,local_3f0);
          auVar52._16_16_ = auVar38;
          auVar52._0_16_ = auVar37;
          local_340 = auVar83._0_32_;
          auVar13 = local_340 & ~auVar52;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar13 >> 0x7f,0) == '\0') &&
                (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar13 >> 0xbf,0) == '\0') &&
              (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar13[0x1f]) {
            auVar28._0_4_ = auVar83._0_4_ ^ auVar37._0_4_;
            auVar28._4_4_ = auVar83._4_4_ ^ auVar37._4_4_;
            auVar28._8_4_ = auVar83._8_4_ ^ auVar37._8_4_;
            auVar28._12_4_ = auVar83._12_4_ ^ auVar37._12_4_;
            auVar28._16_4_ = auVar83._16_4_ ^ auVar38._0_4_;
            auVar28._20_4_ = auVar83._20_4_ ^ auVar38._4_4_;
            auVar28._24_4_ = auVar83._24_4_ ^ auVar38._8_4_;
            auVar28._28_4_ = auVar83._28_4_ ^ auVar38._12_4_;
          }
          else {
            p_Var12 = context->args->filter;
            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              local_3a0 = auVar70._0_32_;
              local_3c0 = auVar73._0_32_;
              local_3e0._0_8_ = pauVar21;
              (*p_Var12)(&local_370);
              auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar83 = ZEXT3264(local_340);
              auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar73 = ZEXT3264(local_3c0);
              auVar70 = ZEXT3264(local_3a0);
              pauVar21 = (undefined1 (*) [16])local_3e0._0_8_;
            }
            auVar37 = vpcmpeqd_avx(auVar88._0_16_,local_400);
            auVar38 = vpcmpeqd_avx(auVar88._0_16_,local_3f0);
            auVar42._16_16_ = auVar38;
            auVar42._0_16_ = auVar37;
            auVar28._0_4_ = auVar83._0_4_ ^ auVar37._0_4_;
            auVar28._4_4_ = auVar83._4_4_ ^ auVar37._4_4_;
            auVar28._8_4_ = auVar83._8_4_ ^ auVar37._8_4_;
            auVar28._12_4_ = auVar83._12_4_ ^ auVar37._12_4_;
            auVar28._16_4_ = auVar83._16_4_ ^ auVar38._0_4_;
            auVar28._20_4_ = auVar83._20_4_ ^ auVar38._4_4_;
            auVar28._24_4_ = auVar83._24_4_ ^ auVar38._8_4_;
            auVar28._28_4_ = auVar83._28_4_ ^ auVar38._12_4_;
            auVar13 = auVar83._0_32_ & ~auVar42;
            if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0x7f,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0xbf,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar13[0x1f] < '\0') {
              auVar13 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])local_370.hit);
              *(undefined1 (*) [32])(local_370.ray + 0x180) = auVar13;
              auVar13 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])(local_370.hit + 0x20));
              *(undefined1 (*) [32])(local_370.ray + 0x1a0) = auVar13;
              auVar13 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])(local_370.hit + 0x40));
              *(undefined1 (*) [32])(local_370.ray + 0x1c0) = auVar13;
              auVar13 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])(local_370.hit + 0x60));
              *(undefined1 (*) [32])(local_370.ray + 0x1e0) = auVar13;
              auVar13 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])(local_370.hit + 0x80));
              *(undefined1 (*) [32])(local_370.ray + 0x200) = auVar13;
              auVar13 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])(local_370.hit + 0xa0));
              *(undefined1 (*) [32])(local_370.ray + 0x220) = auVar13;
              auVar13 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])(local_370.hit + 0xc0));
              *(undefined1 (*) [32])(local_370.ray + 0x240) = auVar13;
              auVar13 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])(local_370.hit + 0xe0));
              *(undefined1 (*) [32])(local_370.ray + 0x260) = auVar13;
              auVar13 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])(local_370.hit + 0x100));
              *(undefined1 (*) [32])(local_370.ray + 0x280) = auVar13;
            }
          }
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0x7f,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0xbf,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar28[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = auVar73._0_4_;
          }
          else {
            auVar73 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_320 + uVar22 * 4) = 0;
          auVar37 = vshufps_avx(auVar73._0_16_,auVar73._0_16_,0);
          auVar29._16_16_ = auVar37;
          auVar29._0_16_ = auVar37;
          auVar13 = vcmpps_avx(auVar70._0_32_,auVar29,2);
          local_320 = vandps_avx(auVar13,local_320);
        }
        if ((((((((local_320 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_320 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_320 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_320 >> 0x7f,0) == '\0') &&
              (local_320 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_320 >> 0xbf,0) == '\0') &&
            (local_320 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_320[0x1f]) {
          return;
        }
        auVar13 = vblendvps_avx(auVar76._0_32_,auVar70._0_32_,local_320);
        auVar14 = vshufps_avx(auVar13,auVar13,0xb1);
        auVar14 = vminps_avx(auVar13,auVar14);
        auVar15 = vshufpd_avx(auVar14,auVar14,5);
        auVar14 = vminps_avx(auVar14,auVar15);
        auVar15 = vperm2f128_avx(auVar14,auVar14,1);
        auVar14 = vminps_avx(auVar14,auVar15);
        auVar14 = vcmpps_avx(auVar13,auVar14,0);
        auVar15 = local_320 & auVar14;
        auVar13 = local_320;
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          auVar13 = vandps_avx(auVar14,local_320);
        }
        uVar18 = vmovmskps_avx(auVar13);
        uVar19 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }